

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointCloudGM.cpp
# Opt level: O2

string * __thiscall
csm::PointCloudGM::getFamily_abi_cxx11_(string *__return_storage_ptr__,PointCloudGM *this)

{
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  GeometricModel::getFamily_abi_cxx11_(&local_28,&this->super_GeometricModel);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"PointCloud",&local_49);
  std::operator+(__return_storage_ptr__,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string PointCloudGM::getFamily() const
{
   return GeometricModel::getFamily() + std::string(CSM_POINTCLOUD_FAMILY);
}